

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool GetBrepFormFaceIndex
               (ON_Extrusion *extrusion,int extrusion_profile_index,
               double extrusion_profile_parameter,bool bCountProfileDiscontinuities,
               int *brep_form_face_index,ON_Interval *profile_segment_domain)

{
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  undefined7 in_register_00000011;
  int iVar4;
  int profile_index;
  double t1;
  double t0;
  double t;
  double local_70;
  double local_68;
  double local_60;
  undefined4 local_58;
  int local_54;
  int *local_50;
  ON_Interval *local_48;
  ON_Extrusion *local_40;
  double local_38;
  
  local_40 = extrusion;
  local_38 = extrusion_profile_parameter;
  iVar2 = ON_Extrusion::ProfileCount(extrusion);
  local_68 = -1.23432101234321e+308;
  local_70 = -1.23432101234321e+308;
  if ((local_38 != -1.23432101234321e+308) || (NAN(local_38))) {
    local_58 = (undefined4)CONCAT71(in_register_00000011,bCountProfileDiscontinuities);
    iVar4 = 0;
    local_54 = 0;
    if (0 < iVar2) {
      local_54 = iVar2;
    }
    local_50 = brep_form_face_index;
    local_48 = profile_segment_domain;
    for (profile_index = 0; brep_form_face_index = local_50, profile_segment_domain = local_48,
        profile_index != local_54; profile_index = profile_index + 1) {
      pOVar3 = ON_Extrusion::Profile(local_40,profile_index);
      if (pOVar3 == (ON_Curve *)0x0) {
        return false;
      }
      bVar1 = ON_Curve::GetDomain(pOVar3,&local_68,&local_70);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_IsValid(local_68);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_IsValid(local_70);
      if (!bVar1) {
        return false;
      }
      if (local_70 <= local_68) {
        return false;
      }
      local_60 = local_70;
      if ((char)local_58 != '\0') {
        while( true ) {
          local_60 = local_70;
          bVar1 = GetNextProfileSegmentDiscontinuity(pOVar3,local_68,local_70,&local_60);
          if (((!bVar1) || (local_60 <= local_68)) || (local_70 <= local_60)) goto LAB_003f5701;
          if (((profile_index == extrusion_profile_index) && (local_68 <= local_38)) &&
             (local_38 < local_60)) break;
          iVar4 = iVar4 + 1;
          local_68 = local_60;
        }
        local_70 = local_60;
      }
LAB_003f5701:
      brep_form_face_index = local_50;
      profile_segment_domain = local_48;
      if (profile_index == extrusion_profile_index) break;
      iVar4 = iVar4 + 1;
    }
  }
  else {
    iVar4 = extrusion_profile_index;
    if ((iVar2 != extrusion_profile_index) &&
       (((pOVar3 = ON_Extrusion::Profile(local_40,extrusion_profile_index),
         pOVar3 == (ON_Curve *)0x0 ||
         (bVar1 = ON_Curve::GetDomain(pOVar3,&local_68,&local_70), !bVar1)) ||
        ((bVar1 = ON_IsValid(local_68), !bVar1 ||
         ((bVar1 = ON_IsValid(local_70), !bVar1 || (local_70 <= local_68)))))))) {
      return false;
    }
  }
  if (brep_form_face_index != (int *)0x0) {
    *brep_form_face_index = iVar4;
  }
  if (extrusion_profile_index < iVar2 && profile_segment_domain != (ON_Interval *)0x0) {
    ON_Interval::Set(profile_segment_domain,local_68,local_70);
  }
  return true;
}

Assistant:

static bool GetBrepFormFaceIndex(
        const ON_Extrusion& extrusion,
        int extrusion_profile_index,
        double extrusion_profile_parameter,
        bool bCountProfileDiscontinuities,
        int* brep_form_face_index,
        ON_Interval* profile_segment_domain
        )
{
  // When extrusion_profile_index = profile_count,
  // it means the caller is looking for the index of
  // the bottom cap.
  int profile_segment_count = 0;
  const int profile_count = extrusion.ProfileCount();
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  const ON_Curve* profile;
  if ( ON_UNSET_VALUE == extrusion_profile_parameter )
  {
    if ( extrusion_profile_index != profile_count )
    {
      profile = extrusion.Profile(extrusion_profile_index);
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }
    }
    profile_segment_count = extrusion_profile_index;
  }
  else
  {
    for ( int i = 0; i < profile_count; i++ )
    {
      profile = extrusion.Profile(i);
      if ( 0 == profile )
        return false;
      // It is important to use the original profile, "profile_segment"
      // and not the trimmed copy in the GetNextDiscontinuity() loop
      // so the code that creates this brep divides the extrusion profile
      // exactly the same way as the code that calculates component indices.
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }

      double t = t1;
      if ( bCountProfileDiscontinuities )
      {
        while ( GetNextProfileSegmentDiscontinuity(profile,t0,t1,&t) )
        {
          if ( t0 < t && t < t1 )
          {
            if ( i == extrusion_profile_index 
                 && t0 <= extrusion_profile_parameter 
                 && extrusion_profile_parameter < t 
               )
            {
              t1 = t;
              break;
            }
            t0 = t;
            t = t1;
            profile_segment_count++;
            continue;
          }
          break;
        }
      }
      if ( i == extrusion_profile_index )
        break;
      profile_segment_count++;
    }
  }

  if ( 0 != brep_form_face_index )
    *brep_form_face_index = profile_segment_count;

  if ( 0 != profile_segment_domain && extrusion_profile_index < profile_count )
    profile_segment_domain->Set(t0,t1);

  return true;
}